

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

DatabaseName * __thiscall
DatabaseSnapshot::allocate_name
          (DatabaseName *__return_storage_ptr__,DatabaseSnapshot *this,string *type)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  ExclusiveFile lock;
  string id;
  string fname;
  path __result;
  stringstream ss;
  ExclusiveFile local_34c;
  DatabaseName *local_348;
  path *local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  path local_278;
  path local_238;
  path local_1f8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_340 = &this->db_base;
  local_348 = __return_storage_ptr__;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    random_hex_string_abi_cxx11_(&local_338,8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(type->_M_dataplus)._M_p,type->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_338._M_dataplus._M_p,local_338._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    pcVar1 = (this->db_name)._M_pathname._M_dataplus._M_p;
    local_278._M_pathname._M_dataplus._M_p = (pointer)&local_278._M_pathname.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_278,pcVar1,pcVar1 + (this->db_name)._M_pathname._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,local_278._M_pathname._M_dataplus._M_p,local_278._M_pathname._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_pathname._M_dataplus._M_p != &local_278._M_pathname.field_2) {
      operator_delete(local_278._M_pathname._M_dataplus._M_p,
                      local_278._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (&local_1f8,&local_298);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_278,local_340);
    std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_278,&local_1f8._M_pathname);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_278._M_pathname._M_dataplus._M_p,
               local_278._M_pathname._M_dataplus._M_p + local_278._M_pathname._M_string_length);
    ExclusiveFile::ExclusiveFile(&local_34c,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_278);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_1f8);
    bVar2 = ExclusiveFile::is_ok(&local_34c);
    if (bVar2) {
      std::experimental::filesystem::v1::__cxx11::path::path(&local_238,local_340);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      pcVar1 = (type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,pcVar1,pcVar1 + type->_M_string_length);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      DatabaseName::DatabaseName(local_348,&local_238,&local_2f8,&local_318,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_238);
    }
    ExclusiveFile::~ExclusiveFile(&local_34c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  } while (!bVar2);
  return local_348;
}

Assistant:

DatabaseName DatabaseSnapshot::allocate_name(const std::string &type) const {
    while (true) {
        // TODO(unknown): limit this to some sane value (like 10000 etc),
        // to avoid infinite loop in exceptional cases.

        std::stringstream ss;
        std::string id(random_hex_string(8));
        ss << type << "." << id << "." << db_name.string();
        std::string fname = ss.str();
        ExclusiveFile lock(db_base / fname);
        if (lock.is_ok()) {
            return DatabaseName(db_base, type, id, fname);
        }
    }
}